

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O0

size_t __thiscall
libtorrent::aux::utp_stream::write_some<boost::asio::const_buffer>
          (utp_stream *this,const_buffer *buffers,error_code *ec)

{
  bool bVar1;
  const_buffer *pcVar2;
  size_t sVar3;
  void *buf;
  size_t ret;
  const_buffer *end;
  const_buffer *i;
  size_t buf_size;
  error_code *ec_local;
  const_buffer *buffers_local;
  utp_stream *this_local;
  
  if (this->m_impl == (utp_socket_impl *)0x0) {
    boost::system::error_code::operator=(ec,not_connected);
    this_local = (utp_stream *)0x0;
  }
  else {
    bVar1 = check_fin_sent(this);
    if (bVar1) {
      boost::system::error_code::operator=(ec,broken_pipe);
      this_local = (utp_stream *)0x0;
    }
    else {
      i = (const_buffer *)0x0;
      end = boost::asio::buffer_sequence_begin<boost::asio::const_buffer>(buffers,(type *)0x0);
      pcVar2 = boost::asio::buffer_sequence_end<boost::asio::const_buffer>(buffers,(type *)0x0);
      for (; end != pcVar2; end = end + 1) {
        sVar3 = boost::asio::const_buffer::size(end);
        if (sVar3 != 0) {
          buf = boost::asio::const_buffer::data(end);
          sVar3 = boost::asio::const_buffer::size(end);
          add_write_buffer(this,buf,(int)sVar3);
          sVar3 = boost::asio::const_buffer::size(end);
          i = (const_buffer *)((long)&i->data_ + sVar3);
        }
      }
      this_local = (utp_stream *)write_some(this,true);
      if ((this_local == (utp_stream *)0x0) && (i != (const_buffer *)0x0)) {
        boost::system::error_code::operator=(ec,try_again);
        this_local = (utp_stream *)0x0;
      }
    }
  }
  return (size_t)this_local;
}

Assistant:

std::size_t write_some(Const_Buffers const& buffers, error_code& ec)
	{
		TORRENT_ASSERT(!m_write_handler);
		if (m_impl == nullptr)
		{
			ec = boost::asio::error::not_connected;
			return 0;
		}

		if (check_fin_sent())
		{
			// we can't send more data after closing the socket
			ec = boost::asio::error::broken_pipe;
			return 0;
		}

		size_t buf_size = 0;

		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
		{
			if (i->size() == 0) continue;
			add_write_buffer(i->data(), int(i->size()));
			buf_size += i->size();
		}
		std::size_t ret = write_some(true);
		TORRENT_ASSERT(ret <= buf_size);
		if (ret == 0 && buf_size > 0)
		{
			ec = boost::asio::error::would_block;
			return 0;
		}
		return ret;
	}